

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_StoCreateGateMaches
               (Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,int **pComp,int **pPerm,
               int *pnPerms,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,int fPinPerm,
               int fPinQuick)

{
  int iVar1;
  undefined4 uVar2;
  word wVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  int local_a4;
  int t;
  int c;
  int p;
  int i;
  word tTemp2;
  word tTemp1;
  word tCur;
  int nMints;
  int nPerms;
  int *Perm2;
  int *Perm1;
  int Perm [6];
  int *pnPerms_local;
  int **pPerm_local;
  int **pComp_local;
  Mio_Cell2_t *pCell_local;
  Vec_Wec_t *vTt2Match_local;
  Vec_Mem_t *vTtMem_local;
  
  iVar1 = pnPerms[*(uint *)&pCell->field_0x10 >> 0x1c];
  uVar2 = *(undefined4 *)&pCell->field_0x10;
  if (6 < *(uint *)&pCell->field_0x10 >> 0x1c) {
    __assert_fail("pCell->nFanins <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0xff,
                  "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  for (c = 0; c < (int)(*(uint *)&pCell->field_0x10 >> 0x1c); c = c + 1) {
    iVar5 = Abc_Var2Lit(c,0);
    Perm[(long)c + -2] = iVar5;
  }
  wVar3 = pCell->uTruth;
  t = 0;
  tTemp1 = wVar3;
  while( true ) {
    wVar4 = tTemp1;
    if (iVar1 <= t) {
      if (wVar3 != tTemp1) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x117,
                      "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      return;
    }
    for (local_a4 = 0; local_a4 < 1 << (byte)((uint)uVar2 >> 0x1c); local_a4 = local_a4 + 1) {
      Nf_StoCreateGateAdd(vTtMem,vTt2Match,pCell,tTemp1,(int *)&Perm1,
                          *(uint *)&pCell->field_0x10 >> 0x1c,vProfs,vStore,fPinFilter,fPinPerm,
                          fPinQuick);
      tTemp1 = Abc_Tt6Flip(tTemp1,pComp[*(uint *)&pCell->field_0x10 >> 0x1c][local_a4]);
      iVar5 = pComp[*(uint *)&pCell->field_0x10 >> 0x1c][local_a4];
      iVar6 = Abc_LitNot(Perm[(long)iVar5 + -2]);
      Perm[(long)iVar5 + -2] = iVar6;
    }
    if (wVar4 != tTemp1) break;
    if (iVar1 != 1) {
      tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,pPerm[*(uint *)&pCell->field_0x10 >> 0x1c][t]);
      iVar5 = pPerm[*(uint *)&pCell->field_0x10 >> 0x1c][t];
      iVar6 = Perm[(long)iVar5 + -2];
      Perm[(long)iVar5 + -2] = Perm[(long)iVar5 + -1];
      Perm[(long)iVar5 + -1] = iVar6;
    }
    t = t + 1;
  }
  __assert_fail("tTemp2 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x10e,
                "void Nf_StoCreateGateMaches(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, int **, int **, int *, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
               );
}

Assistant:

void Nf_StoCreateGateMaches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, int ** pComp, int ** pPerm, int * pnPerms, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    int Perm[NF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    assert( pCell->nFanins <= 6 );
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Nf_StoCreateGateAdd( vTtMem, vTt2Match, pCell, tCur, Perm, pCell->nFanins, vProfs, vStore, fPinFilter, fPinPerm, fPinQuick );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        if ( nPerms == 1 )
            continue;
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}